

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall ON_3dmSettings::Write_v1(ON_3dmSettings *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  ON__INT32 i;
  
  bVar1 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x2000010,0);
  if (bVar1) {
    bVar2 = ON_BinaryArchive::WriteInt(file,1);
    bVar1 = false;
    if (bVar2) {
      bVar3 = (this->m_ModelUnitsAndTolerances).m_unit_system.m_unit_system - Microns;
      i = bVar3 + 1;
      if (9 < bVar3) {
        i = 0;
      }
      bVar2 = ON_BinaryArchive::WriteInt(file,i);
      bVar1 = false;
      if (bVar2) {
        bVar1 = ON_BinaryArchive::WriteDouble
                          (file,(this->m_ModelUnitsAndTolerances).m_absolute_tolerance);
        if ((bVar1) &&
           (bVar1 = ON_BinaryArchive::WriteDouble
                              (file,(this->m_ModelUnitsAndTolerances).m_relative_tolerance), bVar1))
        {
          bVar1 = ON_BinaryArchive::WriteDouble
                            (file,(this->m_ModelUnitsAndTolerances).m_angle_tolerance);
        }
        else {
          bVar1 = false;
        }
      }
    }
    bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
    return (bool)(bVar2 & bVar1);
  }
  return false;
}

Assistant:

bool ON_3dmSettings::Write_v1(ON_BinaryArchive& file) const
{
  bool rc = true;

  // version 1 units and tolerances chunk
  rc = file.BeginWrite3dmChunk(TCODE_UNIT_AND_TOLERANCES,0);
  if (rc) {
    rc = ON_3dmSettings_Write_v1_TCODE_UNIT_AND_TOLERANCES( file, m_ModelUnitsAndTolerances );
    if (!file.EndWrite3dmChunk())
      rc = false;
  }

  return rc;
}